

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReadProgram.cpp
# Opt level: O3

string * ReadProgram_abi_cxx11_(void)

{
  char cVar1;
  long *plVar2;
  string *in_RDI;
  char ch;
  ifstream in;
  char local_228 [520];
  
  std::ifstream::ifstream(local_228);
  std::ifstream::open(local_228,0x12402e);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Failed to open file.",0x14);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
    std::ostream::put('H');
    std::ostream::flush();
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    std::__cxx11::string::_M_construct<char_const*>();
  }
  else {
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    in_RDI->_M_string_length = 0;
    (in_RDI->field_2)._M_local_buf[0] = '\0';
    while( true ) {
      plVar2 = (long *)std::istream::get(local_228);
      if ((*(byte *)((long)plVar2 + *(long *)(*plVar2 + -0x18) + 0x20) & 5) != 0) break;
      std::__cxx11::string::push_back((char)in_RDI);
    }
  }
  std::ifstream::~ifstream(local_228);
  return in_RDI;
}

Assistant:

std::string ReadProgram() {
    char *inputfilename = "test.txt";
    std::ifstream in;
    in.open(inputfilename);
    if (!in.is_open()) {//未能打开文件
        std::cout << "Failed to open file." << std::endl;
        return "";
    }
    char ch;
    std::string ret;
    while (in.get(ch)) {
        ret += ch;
    }
    return ret;
}